

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha_test.cc
# Opt level: O0

void __thiscall SHATest_SHA512ABI_Test::TestBody(SHATest_SHA512ABI_Test *this)

{
  int iVar1;
  int iVar2;
  const_iterator piVar3;
  size_t blocks;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 local_108;
  undefined4 local_104;
  initializer_list<int> local_100;
  initializer_list<int> *local_f0;
  initializer_list<int> *__range1;
  SHA512_CTX ctx;
  SHATest_SHA512ABI_Test *this_local;
  
  ctx._208_8_ = this;
  SHA512_Init((SHA512_CTX *)&__range1);
  __begin1._0_4_ = 1;
  __begin1._4_4_ = 2;
  local_108 = 3;
  local_104 = 4;
  local_100._M_array = (iterator)&__begin1;
  local_100._M_len = 4;
  local_f0 = &local_100;
  __end1 = std::initializer_list<int>::begin(local_f0);
  piVar3 = std::initializer_list<int>::end(local_f0);
  for (; __end1 != piVar3; __end1 = __end1 + 1) {
    iVar1 = *__end1;
    iVar2 = sha512_avx_capable();
    if (iVar2 != 0) {
      abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_char_const*,unsigned_long>
                ("sha512_block_data_order_avx, ctx.h, kBuf, blocks",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/sha/sha_test.cc"
                 ,0x8a,true,sha512_block_data_order_avx,(Type)&__range1,"",(long)iVar1);
    }
    abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_char_const*,unsigned_long>
              ("sha512_block_data_order_nohw, ctx.h, kBuf, blocks",
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/sha/sha_test.cc"
               ,0x93,true,sha512_block_data_order_nohw,(Type)&__range1,"",(long)iVar1);
  }
  return;
}

Assistant:

TEST(SHATest, SHA512ABI) {
  SHA512_CTX ctx;
  SHA512_Init(&ctx);

  static const uint8_t kBuf[SHA512_CBLOCK * 4] = {0};
  for (size_t blocks : {1, 2, 3, 4}) {
#if defined(SHA512_ASM)
    CHECK_ABI(sha512_block_data_order, ctx.h, kBuf, blocks);
#endif
#if defined(SHA512_ASM_HW)
    if (sha512_hw_capable()) {
      CHECK_ABI(sha512_block_data_order_hw, ctx.h, kBuf, blocks);
    }
#endif
#if defined(SHA512_ASM_AVX)
    if (sha512_avx_capable()) {
      CHECK_ABI(sha512_block_data_order_avx, ctx.h, kBuf, blocks);
    }
#endif
#if defined(SHA512_ASM_NEON)
    if (CRYPTO_is_NEON_capable()) {
      CHECK_ABI(sha512_block_data_order_neon, ctx.h, kBuf, blocks);
    }
#endif
#if defined(SHA512_ASM_NOHW)
    CHECK_ABI(sha512_block_data_order_nohw, ctx.h, kBuf, blocks);
#endif
  }
}